

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::Window(Window *this,IWindow *parent)

{
  int iVar1;
  
  (this->super_enable_shared_from_this<cursespp::IWindow>)._M_weak_this.
  super___weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cursespp::IWindow>)._M_weak_this.
  super___weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IWindow).super_IOrderable._vptr_IOrderable = (_func_int **)&PTR__Window_001c2550;
  (this->super_IWindow).super_IDisplayable._vptr_IDisplayable = (_func_int **)&DAT_001c2720;
  (this->super_IWindow).super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Window_001c2750;
  (this->super_IWindow).super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Window_001c2778;
  sigslot::
  signal2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  ::signal2(&this->MouseEvent);
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  this->lastNotifiedVisible = false;
  this->framePanel = (PANEL *)0x0;
  this->frame = (WINDOW *)0x0;
  this->contentPanel = (PANEL *)0x0;
  this->content = (WINDOW *)0x0;
  this->parent = parent;
  this->lastAbsoluteX = 0;
  this->lastAbsoluteY = 0;
  this->width = 0;
  this->height = 0;
  this->x = 0;
  this->y = 0;
  (this->contentColor).value = 0x700;
  (this->frameColor).value = 0x800;
  (this->focusedContentColor).value = 0x700;
  (this->focusedFrameColor).value = 0x900;
  this->drawFrame = true;
  this->isVisibleInParent = false;
  this->isDirty = true;
  this->focusOrder = -1;
  iVar1 = NEXT_ID + 1;
  this->id = NEXT_ID;
  NEXT_ID = iVar1;
  this->badBounds = false;
  (**(code **)(messageQueue + 0x38))(&messageQueue,&(this->super_IWindow).super_IMessageTarget);
  return;
}

Assistant:

Window::Window(IWindow *parent) {
    this->frame = this->content = 0;
    this->framePanel = this->contentPanel = 0;
    this->parent = parent;
    this->height = 0;
    this->width = 0;
    this->x = 0;
    this->y = 0;
    this->lastAbsoluteX = 0;
    this->lastAbsoluteY = 0;
    this->contentColor = Color(Color::ContentColorDefault);
    this->frameColor = Color(Color::FrameDefault);
    this->focusedContentColor = Color(Color::ContentColorDefault);
    this->focusedFrameColor = Color(Color::FrameFocused);
    this->drawFrame = true;
    this->isVisibleInParent = false;
    this->isDirty = true;
    this->focusOrder = -1;
    this->id = NEXT_ID++;
    this->badBounds = false;
    Window::MessageQueue().Register(this);
}